

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::parsing::TokenKind>::emplaceRealloc<slang::parsing::TokenKind_const&>
          (SmallVectorBase<slang::parsing::TokenKind> *this,pointer pos,TokenKind *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pTVar4;
  long lVar5;
  pointer pTVar6;
  EVP_PKEY_CTX *ctx;
  TokenKind *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::parsing::TokenKind> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  TokenKind *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::parsing::TokenKind> *)0x53e58b);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pTVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)pTVar4;
  pTVar6 = (pointer)operator_new(0x53e5e8);
  pTVar6[lVar5 >> 1] = *in_RDX;
  pTVar4 = end(in_RDI);
  if (in_RSI == pTVar4) {
    pTVar4 = begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::uninitialized_move<slang::parsing::TokenKind*,slang::parsing::TokenKind*>
              (in_RSI,__last,pTVar4);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<slang::parsing::TokenKind*,slang::parsing::TokenKind*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::uninitialized_move<slang::parsing::TokenKind*,slang::parsing::TokenKind*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pTVar6;
  return pTVar6 + (lVar5 >> 1);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}